

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

bool __thiscall
ThreadedReplayer::enqueue_create_sampler
          (ThreadedReplayer *this,Hash index,VkSamplerCreateInfo *create_info,VkSampler *sampler)

{
  mapped_type pVVar1;
  bool bVar2;
  VkResult VVar3;
  mapped_type *ppVVar4;
  long in_FS_OFFSET;
  Hash local_28;
  
  if ((this->per_thread_data).
      super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
      ._M_impl.super__Vector_impl_data._M_start[*(uint *)(in_FS_OFFSET + -0x18)].expected_tag -
      RESOURCE_SAMPLER < 3) {
    local_28 = index;
    bVar2 = ::Fossilize::FeatureFilter::sampler_is_supported
                      (&((this->device)._M_t.
                         super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                         .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                        feature_filter,create_info);
    if (bVar2) {
      VVar3 = ::Fossilize::VulkanDevice::create_sampler_with_ycbcr_remap
                        ((this->device)._M_t.
                         super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                         .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl,
                         create_info,sampler);
      if (VVar3 == VK_SUCCESS) {
        pVVar1 = *sampler;
        ppVVar4 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->samplers,&local_28);
        *ppVVar4 = pVVar1;
        return true;
      }
      enqueue_create_sampler((ThreadedReplayer *)index);
    }
    else {
      enqueue_create_sampler((ThreadedReplayer *)index);
    }
  }
  return false;
}

Assistant:

bool enqueue_create_sampler(Hash index, const VkSamplerCreateInfo *create_info, VkSampler *sampler) override
	{
		auto &per_thread = get_per_thread_data();
		if (per_thread.expected_tag != RESOURCE_SAMPLER &&
		    per_thread.expected_tag != RESOURCE_DESCRIPTOR_SET_LAYOUT &&
		    per_thread.expected_tag != RESOURCE_PIPELINE_LAYOUT)
		{
			return false;
		}

		if (!device->get_feature_filter().sampler_is_supported(create_info))
		{
			LOGW("Sampler %016" PRIx64 " is not supported. Skipping.\n", index);
			return false;
		}

		if (device->create_sampler_with_ycbcr_remap(create_info, sampler) != VK_SUCCESS)
		{
			LOGE("Creating sampler %016" PRIx64 " Failed!\n", index);
			return false;
		}

		samplers[index] = *sampler;
		return true;
	}